

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
hta::detail::make_exception<const_char_*,_long,_const_char_*,_long>::operator()
          (make_exception<const_char_*,_long,_const_char_*,_long> *this,stringstream *msg,char *arg,
          long args,char *args_1,long args_2)

{
  make_exception<long,_const_char_*,_long> local_21;
  
  std::operator<<((ostream *)(msg + 0x10),arg);
  make_exception<long,_const_char_*,_long>::operator()(&local_21,msg,args,args_1,args_2);
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }